

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_substring_after
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set *set_00;
  int iVar1;
  int iVar2;
  lys_node *plVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ly_ctx *plVar8;
  
  set_00 = *args;
  if ((options & 0x1cU) == 0) {
    iVar2 = lyxp_set_cast(set_00,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    pcVar6 = (args[1]->val).str;
    pcVar7 = strstr(((*args)->val).str,pcVar6);
    if (pcVar7 != (char *)0x0) {
      sVar4 = strlen(pcVar6);
      sVar5 = strlen(pcVar7 + sVar4);
      set_fill_string(set,pcVar7 + sVar4,(uint16_t)sVar5);
      return 0;
    }
    set_fill_string(set,"",0);
    return 0;
  }
  iVar2 = 0;
  if ((set_00->type == LYXP_SET_SNODE_SET) &&
     (plVar3 = warn_get_snode_in_ctx(set_00), plVar3 != (lys_node *)0x0)) {
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar8 = param_4->ctx;
      pcVar6 = strnodetype(plVar3->nodetype);
      pcVar7 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_00179cb2;
      plVar8 = param_4->ctx;
      pcVar6 = plVar3->name;
      pcVar7 = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    iVar2 = 1;
    ly_log(plVar8,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",pcVar6);
  }
LAB_00179cb2:
  if ((args[1]->type == LYXP_SET_SNODE_SET) &&
     (plVar3 = warn_get_snode_in_ctx(args[1]), plVar3 != (lys_node *)0x0)) {
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar8 = param_4->ctx;
      pcVar6 = strnodetype(plVar3->nodetype);
      pcVar7 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_00179d36;
      plVar8 = param_4->ctx;
      pcVar6 = plVar3->name;
      pcVar7 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    iVar2 = 1;
    ly_log(plVar8,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",pcVar6);
  }
LAB_00179d36:
  set_snode_clear_ctx(set);
  return iVar2;
}

Assistant:

static int
xpath_substring_after(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                      struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    char *ptr;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return EXIT_SUCCESS;
}